

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_cookie.c
# Opt level: O0

uchar * ares_dns_cookie_fetch(ares_dns_record_t *dnsrec,size_t *len)

{
  ares_bool_t aVar1;
  ares_dns_record_t *local_30;
  uchar *val;
  ares_dns_rr_t *rr;
  size_t *len_local;
  ares_dns_record_t *dnsrec_local;
  
  rr = (ares_dns_rr_t *)len;
  len_local = (size_t *)dnsrec;
  val = (uchar *)ares_dns_get_opt_rr_const(dnsrec);
  local_30 = (ares_dns_record_t *)0x0;
  rr->parent = (ares_dns_record_t *)0x0;
  if ((ares_dns_rr_t *)val == (ares_dns_rr_t *)0x0) {
    dnsrec_local = (ares_dns_record_t *)0x0;
  }
  else {
    aVar1 = ares_dns_rr_get_opt_byid
                      ((ares_dns_rr_t *)val,ARES_RR_OPT_OPTIONS,10,(uchar **)&local_30,(size_t *)rr)
    ;
    if (aVar1 == ARES_FALSE) {
      dnsrec_local = (ares_dns_record_t *)0x0;
    }
    else {
      dnsrec_local = local_30;
    }
  }
  return (uchar *)dnsrec_local;
}

Assistant:

static const unsigned char *
  ares_dns_cookie_fetch(const ares_dns_record_t *dnsrec, size_t *len)
{
  const ares_dns_rr_t *rr  = ares_dns_get_opt_rr_const(dnsrec);
  const unsigned char *val = NULL;
  *len                     = 0;

  if (rr == NULL) {
    return NULL;
  }

  if (!ares_dns_rr_get_opt_byid(rr, ARES_RR_OPT_OPTIONS, ARES_OPT_PARAM_COOKIE,
                                &val, len)) {
    return NULL;
  }

  return val;
}